

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
mapbox::
earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
          (vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
           *poly)

{
  Earcut<unsigned_int> *in_RDI;
  Earcut<unsigned_int> earcut;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff38;
  Earcut<unsigned_int> *this;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  Earcut<unsigned_int> *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  detail::Earcut<unsigned_int>::Earcut((Earcut<unsigned_int> *)&stack0xffffffffffffff68);
  detail::Earcut<unsigned_int>::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->indices,in_stack_ffffffffffffff38);
  detail::Earcut<unsigned_int>::~Earcut(this);
  return &in_RDI->indices;
}

Assistant:

std::vector<N> earcut(const Polygon& poly) {
    mapbox::detail::Earcut<N> earcut;
    earcut(poly);
    return std::move(earcut.indices);
}